

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Upsert * sqlite3UpsertNew(sqlite3 *db,ExprList *pTarget,Expr *pTargetWhere,ExprList *pSet,
                         Expr *pWhere)

{
  Upsert *pUVar1;
  
  if (db == (sqlite3 *)0x0) {
    pUVar1 = (Upsert *)sqlite3Malloc(0x40);
  }
  else {
    pUVar1 = (Upsert *)sqlite3DbMallocRawNN(db,0x40);
  }
  if (pUVar1 == (Upsert *)0x0) {
    if (pTarget != (ExprList *)0x0) {
      exprListDeleteNN(db,pTarget);
    }
    if (pTargetWhere != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,pTargetWhere);
    }
    if (pSet != (ExprList *)0x0) {
      exprListDeleteNN(db,pSet);
    }
    if (pWhere != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,pWhere);
    }
  }
  else {
    pUVar1->pUpsertTarget = pTarget;
    pUVar1->pUpsertTargetWhere = pTargetWhere;
    pUVar1->pUpsertSet = pSet;
    pUVar1->pUpsertWhere = pWhere;
    pUVar1->pUpsertIdx = (Index *)0x0;
  }
  return pUVar1;
}

Assistant:

SQLITE_PRIVATE Upsert *sqlite3UpsertNew(
  sqlite3 *db,           /* Determines which memory allocator to use */
  ExprList *pTarget,     /* Target argument to ON CONFLICT, or NULL */
  Expr *pTargetWhere,    /* Optional WHERE clause on the target */
  ExprList *pSet,        /* UPDATE columns, or NULL for a DO NOTHING */
  Expr *pWhere           /* WHERE clause for the ON CONFLICT UPDATE */
){
  Upsert *pNew;
  pNew = sqlite3DbMallocRaw(db, sizeof(Upsert));
  if( pNew==0 ){
    sqlite3ExprListDelete(db, pTarget);
    sqlite3ExprDelete(db, pTargetWhere);
    sqlite3ExprListDelete(db, pSet);
    sqlite3ExprDelete(db, pWhere);
    return 0;
  }else{
    pNew->pUpsertTarget = pTarget;
    pNew->pUpsertTargetWhere = pTargetWhere;
    pNew->pUpsertSet = pSet;
    pNew->pUpsertWhere = pWhere;
    pNew->pUpsertIdx = 0;
  }
  return pNew;
}